

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::iterate
          (ViewportCallOrderCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  int extraout_var;
  RenderTarget *pRVar7;
  ShaderProgram *pSVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  ObjectWrapper *this_00;
  ConstPixelBufferAccess local_9c0;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  LogImage local_948;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  LogImageSet local_868;
  MessageBuilder local_828;
  PixelBufferAccess local_6a8;
  PixelBufferAccess local_680;
  MessageBuilder local_658;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  int local_1d8;
  int local_1d4;
  MessageBuilder local_1d0;
  int local_50;
  int orderNdx;
  undefined1 local_40 [8];
  Surface resultSurface;
  GLint posLocation;
  IVec2 viewportSize;
  Functions *gl;
  ViewportCallOrderCase *this_local;
  
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  viewportSize.m_data[0] = (*pRVar6->_vptr_RenderContext[3])();
  viewportSize.m_data[1] = extraout_var;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getWidth(pRVar7);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar7);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffe0,iVar3,iVar4);
  pcVar1 = *(code **)((long)viewportSize.m_data + 0x780);
  pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  dVar5 = glu::ShaderProgram::getProgram(pSVar8);
  resultSurface.m_pixels.m_cap._4_4_ = (*pcVar1)(dVar5,"a_position");
  iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffe0);
  iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffe0);
  tcu::Surface::Surface((Surface *)local_40,iVar3,iVar4);
  (**(code **)((long)viewportSize.m_data + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)((long)viewportSize.m_data + 0x188))(0x4000);
  for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
    if (((local_50 == 0) && (this->m_callOrder == VIEWPORT_FIRST)) ||
       ((local_50 == 1 && (this->m_callOrder == BBOX_FIRST)))) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1d0,
                           (char (*) [63])
                           "Setting viewport to cover the left half of the render target.\n");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [9])"\t(0, 0, ");
      local_1d4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffe0);
      local_1d4 = local_1d4 / 2;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1d4);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0xf95514);
      local_1d8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffe0);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1d8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0xf2e642);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
      pcVar1 = *(code **)((long)viewportSize.m_data + 0x1a00);
      iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffe0);
      tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffe0);
      (*pcVar1)(0,0,iVar3 / 2);
    }
    else {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_358,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_358,
                           (char (*) [65])
                           "Setting bounding box to cover the right half of the clip space.\n");
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [49])
                                   "\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_358);
      (**(code **)((long)viewportSize.m_data + 0x1040))
                (0,0xbf800000,0xbf800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    }
  }
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4d8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_4d8,
                       (char (*) [58])"Rendering mesh covering the right half of the clip space.");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d8);
  pcVar1 = *(code **)((long)viewportSize.m_data + 0x40);
  this_00 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             ::operator*(&(this->m_vbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        )->super_ObjectWrapper;
  dVar5 = glu::ObjectWrapper::operator*(this_00);
  (*pcVar1)(0x8892,dVar5);
  (**(code **)((long)viewportSize.m_data + 0x19f0))
            (resultSurface.m_pixels.m_cap._4_4_,4,0x1406,0,0x10,0);
  (**(code **)((long)viewportSize.m_data + 0x610))(resultSurface.m_pixels.m_cap._4_4_);
  pcVar1 = *(code **)((long)viewportSize.m_data + 0x1680);
  pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  dVar5 = glu::ShaderProgram::getProgram(pSVar8);
  (*pcVar1)(dVar5);
  (**(code **)((long)viewportSize.m_data + 0xfd8))(0x8e72,3);
  (**(code **)((long)viewportSize.m_data + 0x538))(0xe,0,this->m_numVertices);
  dVar5 = (**(code **)((long)viewportSize.m_data + 0x800))();
  glu::checkError(dVar5,"post-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x128e);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_658,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_658,(char (*) [16])"Verifying image");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_658);
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_680,(Surface *)local_40);
  glu::readPixels(pRVar6,0,0,&local_680);
  tcu::Surface::getAccess(&local_6a8,(Surface *)local_40);
  bVar2 = verifyImage(this,&local_6a8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_828,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_828,(char (*) [11])"Result ok.");
    pTVar9 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"Images",&local_889);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b0,"Image verification",&local_8b1);
    tcu::LogImageSet::LogImageSet(&local_868,&local_888,&local_8b0);
    pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_868);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"Result",&local_969);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"Result",&local_991);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_9c0,(Surface *)local_40);
    tcu::LogImage::LogImage
              (&local_948,&local_968,&local_990,&local_9c0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_948);
    tcu::TestLog::operator<<(pTVar9,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_948);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    tcu::LogImageSet::~LogImageSet(&local_868);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator(&local_8b1);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator(&local_889);
    tcu::MessageBuilder::~MessageBuilder(&local_828);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  tcu::Surface::~Surface((Surface *)local_40);
  return STOP;
}

Assistant:

ViewportCallOrderCase::IterateResult ViewportCallOrderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		viewportSize	= tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	const glw::GLint		posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			resultSurface	(viewportSize.x(), viewportSize.y());

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// set state
	for (int orderNdx = 0; orderNdx < 2; ++orderNdx)
	{
		if ((orderNdx == 0 && m_callOrder == VIEWPORT_FIRST) ||
			(orderNdx == 1 && m_callOrder == BBOX_FIRST))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting viewport to cover the left half of the render target.\n"
				<< "\t(0, 0, " << (viewportSize.x()/2) << ", " << viewportSize.y() << ")"
				<< tcu::TestLog::EndMessage;

			gl.viewport(0, 0, viewportSize.x()/2, viewportSize.y());
		}
		else
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting bounding box to cover the right half of the clip space.\n"
				<< "\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)"
				<< tcu::TestLog::EndMessage;

			gl.primitiveBoundingBox(0.0f, -1.0f, -1.0f, 1.0f,
									1.0f,  1.0f,  1.0f, 1.0f);
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering mesh covering the right half of the clip space."
		<< tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, sizeof(float[4]), (const float*)DE_NULL);
	gl.enableVertexAttribArray(posLocation);
	gl.useProgram(m_program->getProgram());
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.drawArrays(GL_PATCHES, 0, m_numVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying image"
		<< tcu::TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	if (!verifyImage(resultSurface.getAccess()))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Result", "Result", resultSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}